

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
::~Singleton(Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             *this)

{
  (this->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub =
       (_func_int **)&PTR__RegistryHub_0017a4c8;
  (this->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub =
       (_func_int **)&PTR__RegistryHub_0017a548;
  (this->super_RegistryHub).super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__RegistryHub_0017a5a0;
  Detail::EnumValuesRegistry::~EnumValuesRegistry(&(this->super_RegistryHub).m_enumValuesRegistry);
  clara::std::
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  ::~vector(&(this->super_RegistryHub).m_exceptionRegistry.m_exceptions);
  TagAliasRegistry::~TagAliasRegistry(&(this->super_RegistryHub).m_tagAliasRegistry);
  ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry
            (&(this->super_RegistryHub).m_exceptionTranslatorRegistry);
  ReporterRegistry::~ReporterRegistry(&(this->super_RegistryHub).m_reporterRegistry);
  TestRegistry::~TestRegistry(&(this->super_RegistryHub).m_testCaseRegistry);
  return;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }